

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

void Aig_TableProfile(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pEntry;
  Aig_Man_t *p_local;
  
  uVar1 = p->nTableSize;
  uVar2 = Aig_ManNodeNum(p);
  printf("Table size = %d. Entries = %d.\n",(ulong)uVar1,(ulong)uVar2);
  for (local_1c = 0; local_1c < p->nTableSize; local_1c = local_1c + 1) {
    local_20 = 0;
    for (_Counter = p->pTable[local_1c]; _Counter != (Aig_Obj_t *)0x0;
        _Counter = (_Counter->field_0).pNext) {
      local_20 = local_20 + 1;
    }
    if (local_20 != 0) {
      printf("%d ",(ulong)local_20);
    }
  }
  return;
}

Assistant:

void Aig_TableProfile( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry;
    int i, Counter;
    printf( "Table size = %d. Entries = %d.\n", p->nTableSize, Aig_ManNodeNum(p) );
    for ( i = 0; i < p->nTableSize; i++ )
    {
        Counter = 0;
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
}